

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::Pipeline::GetOperators
          (vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *__return_storage_ptr__,
          Pipeline *this)

{
  pointer *pprVar1;
  pointer prVar2;
  iterator iVar3;
  reference_wrapper<duckdb::PhysicalOperator> *op;
  pointer prVar4;
  reference_wrapper<duckdb::PhysicalOperator> local_30;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->source);
  local_30._M_data = (this->source).ptr;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)__return_storage_ptr__,(iterator)0x0,&local_30);
  prVar4 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar2 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar4 != prVar2) {
    do {
      local_30._M_data = prVar4->_M_data;
      iVar3._M_current =
           (__return_storage_ptr__->
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ).
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
                  ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                    *)__return_storage_ptr__,iVar3,&local_30);
      }
      else {
        (iVar3._M_current)->_M_data = local_30._M_data;
        pprVar1 = &(__return_storage_ptr__->
                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
      }
      prVar4 = prVar4 + 1;
    } while (prVar4 != prVar2);
  }
  if ((this->sink).ptr != (PhysicalOperator *)0x0) {
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->sink);
    local_30._M_data = (this->sink).ptr;
    iVar3._M_current =
         (__return_storage_ptr__->
         super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         ).
         super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                  *)__return_storage_ptr__,iVar3,&local_30);
    }
    else {
      (iVar3._M_current)->_M_data = local_30._M_data;
      pprVar1 = &(__return_storage_ptr__->
                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<reference<PhysicalOperator>> Pipeline::GetOperators() {
	vector<reference<PhysicalOperator>> result;
	D_ASSERT(source);
	result.push_back(*source);
	for (auto &op : operators) {
		result.push_back(op.get());
	}
	if (sink) {
		result.push_back(*sink);
	}
	return result;
}